

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.hpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine::
shaderCollectionForSamplingRoutine
          (shaderCollectionForSamplingRoutine *this,shaderCollectionForSamplingRoutine *param_1)

{
  shaderCollectionForSamplingRoutine *param_1_local;
  shaderCollectionForSamplingRoutine *this_local;
  
  shaderDefinition::shaderDefinition
            (&this->pass_through_vertex_shader,&param_1->pass_through_vertex_shader);
  shaderDefinition::shaderDefinition
            (&this->pass_through_tesselation_control_shader,
             &param_1->pass_through_tesselation_control_shader);
  shaderDefinition::shaderDefinition
            (&this->sampling_compute_shader,&param_1->sampling_compute_shader);
  shaderDefinition::shaderDefinition
            (&this->sampling_fragment_shader,&param_1->sampling_fragment_shader);
  shaderDefinition::shaderDefinition
            (&this->sampling_geometry_shader,&param_1->sampling_geometry_shader);
  shaderDefinition::shaderDefinition
            (&this->sampling_tesselation_control_shader,
             &param_1->sampling_tesselation_control_shader);
  shaderDefinition::shaderDefinition
            (&this->sampling_tesselation_evaluation_shader,
             &param_1->sampling_tesselation_evaluation_shader);
  shaderDefinition::shaderDefinition(&this->sampling_vertex_shader,&param_1->sampling_vertex_shader)
  ;
  this->m_sampling_function = param_1->m_sampling_function;
  return;
}

Assistant:

shaderCollectionForSamplingRoutine() : m_sampling_function(Texture)
		{
		}